

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

PerThreadSynch *
absl::lts_20250127::Enqueue(PerThreadSynch *head,SynchWaitParams *waitp,intptr_t mu,int flags)

{
  int iVar1;
  SynchWaitParams *pSVar2;
  PerThreadSynch *pPVar3;
  uint uVar4;
  undefined8 in_RAX;
  PerThreadSynch *pPVar5;
  long lVar6;
  pthread_t __target_thread;
  ThreadIdentity *pTVar7;
  PerThreadSynch *pPVar8;
  intptr_t extraout_RDX;
  PerThreadSynch *pPVar9;
  uint unaff_EBP;
  PerThreadSynch *pPVar10;
  synchronization_internal *this;
  intptr_t unaff_R12;
  ThreadIdentity *y;
  bool bVar11;
  double dVar12;
  sched_param param;
  int policy;
  undefined8 local_38;
  
  local_38._0_4_ = (int)in_RAX;
  y = (ThreadIdentity *)waitp->cv_word;
  if (y != (ThreadIdentity *)0x0) {
    waitp->cv_word = (atomic<long> *)0x0;
    this = (synchronization_internal *)0x0;
    local_38 = in_RAX;
    do {
      pPVar8 = (y->per_thread_synch).next;
      if (((ulong)pPVar8 & 1) == 0) {
        LOCK();
        pPVar5 = (y->per_thread_synch).next;
        bVar11 = pPVar8 == pPVar5;
        if (bVar11) {
          (y->per_thread_synch).next = (PerThreadSynch *)((ulong)pPVar8 | 1);
          pPVar5 = pPVar8;
        }
        UNLOCK();
        if (bVar11) goto LAB_00340e15;
      }
      uVar4 = synchronization_internal::MutexDelay(this,1,(int)mu);
      this = (synchronization_internal *)(ulong)uVar4;
      mu = extraout_RDX;
    } while( true );
  }
  y = (ThreadIdentity *)waitp->thread;
  pSVar2 = (y->per_thread_synch).waitp;
  if ((pSVar2 != waitp && pSVar2 != (SynchWaitParams *)0x0) &&
     ((y->per_thread_synch).suppress_fatal_errors == false)) goto LAB_003410c2;
  (y->per_thread_synch).waitp = waitp;
  (y->per_thread_synch).skip = (PerThreadSynch *)0x0;
  (y->per_thread_synch).may_skip = true;
  (y->per_thread_synch).wake = false;
  (y->per_thread_synch).cond_waiter = (bool)((byte)((uint)flags >> 1) & 1);
  if ((flags & 4U) == 0) {
    pTVar7 = base_internal::CurrentThreadIdentityIfPresent();
    if (pTVar7 == (ThreadIdentity *)0x0) goto LAB_003410c7;
    goto LAB_00340eb3;
  }
LAB_00340f45:
  pTVar7 = y;
  if (head == (PerThreadSynch *)0x0) {
    (y->per_thread_synch).next = &y->per_thread_synch;
    (y->per_thread_synch).readers = mu;
    (y->per_thread_synch).maybe_unlocking = false;
    goto LAB_003410a0;
  }
  iVar1 = (y->per_thread_synch).priority;
  if (head->priority < iVar1) {
    pPVar8 = head;
    if (head->maybe_unlocking == false) {
      do {
        pPVar9 = pPVar8;
        pPVar5 = pPVar9->next;
        pPVar10 = pPVar5->skip;
        pPVar8 = pPVar5;
        if (pPVar10 != (PerThreadSynch *)0x0) {
          pPVar3 = pPVar5;
          pPVar8 = pPVar10;
          for (pPVar10 = pPVar10->skip; pPVar10 != (PerThreadSynch *)0x0; pPVar10 = pPVar10->skip) {
            pPVar3->skip = pPVar10;
            pPVar3 = pPVar8;
            pPVar8 = pPVar10;
          }
          pPVar5->skip = pPVar8;
        }
      } while (iVar1 <= pPVar8->priority);
    }
    else {
      if (waitp->how != (MuHow)kExclusiveS) goto LAB_00340f65;
      pPVar9 = (PerThreadSynch *)0x0;
      if (waitp->cond == (Condition *)0x0) {
        pPVar9 = head;
      }
    }
  }
  else {
LAB_00340f65:
    pPVar9 = (PerThreadSynch *)0x0;
  }
  if (pPVar9 == (PerThreadSynch *)0x0) {
    if ((((flags & 1U) == 0) || (iVar1 < head->next->priority)) ||
       ((head->maybe_unlocking == true &&
        ((waitp->how != (MuHow)kExclusiveS || (waitp->cond != (Condition *)0x0)))))) {
      (y->per_thread_synch).next = head->next;
      head->next = &y->per_thread_synch;
      (y->per_thread_synch).readers = head->readers;
      (y->per_thread_synch).maybe_unlocking = head->maybe_unlocking;
      if ((head->may_skip == true) &&
         (bVar11 = MuEquivalentWaiter(head,&y->per_thread_synch), bVar11)) {
        head->skip = &y->per_thread_synch;
      }
      goto LAB_003410a0;
    }
    (y->per_thread_synch).next = head->next;
    head->next = &y->per_thread_synch;
  }
  else {
    (y->per_thread_synch).next = pPVar9->next;
    pPVar9->next = &y->per_thread_synch;
    if ((pPVar9->skip != (PerThreadSynch *)0x0) &&
       (bVar11 = MuEquivalentWaiter(pPVar9,&y->per_thread_synch), !bVar11)) {
      Enqueue();
LAB_003410d6:
      __assert_fail("s == Synch_GetPerThread()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x3b1,
                    "PerThreadSynch *absl::Enqueue(PerThreadSynch *, SynchWaitParams *, intptr_t, int)"
                   );
    }
    if (((pPVar9 != head) && (pPVar9->may_skip == true)) &&
       (bVar11 = MuEquivalentWaiter(pPVar9,&y->per_thread_synch), bVar11)) {
      pPVar9->skip = &y->per_thread_synch;
    }
  }
  pPVar8 = (y->per_thread_synch).next;
  bVar11 = MuEquivalentWaiter(&y->per_thread_synch,pPVar8);
  pTVar7 = (ThreadIdentity *)head;
  if (bVar11) {
    (y->per_thread_synch).skip = pPVar8;
  }
LAB_003410a0:
  (y->per_thread_synch).state._M_i = kQueued;
  return &pTVar7->per_thread_synch;
LAB_00340e15:
  pPVar8 = waitp->thread;
  if (pPVar8->waitp == (SynchWaitParams *)0x0) {
    pPVar8->waitp = waitp;
    pPVar9 = (PerThreadSynch *)((ulong)pPVar5 & 0xfffffffffffffffc);
    pPVar10 = pPVar8;
    if (pPVar9 != (PerThreadSynch *)0x0) {
      pPVar8->next = pPVar9->next;
      pPVar10 = pPVar9;
    }
    pPVar10->next = pPVar8;
    (pPVar8->state)._M_i = kQueued;
    (y->per_thread_synch).next =
         (PerThreadSynch *)((ulong)((uint)pPVar5 & 2) | (ulong)waitp->thread);
    return head;
  }
  Enqueue();
  mu = unaff_R12;
  flags = unaff_EBP;
LAB_003410c2:
  Enqueue();
LAB_003410c7:
  pTVar7 = synchronization_internal::CreateThreadIdentity();
LAB_00340eb3:
  if (y != pTVar7) goto LAB_003410d6;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar6 = rdtsc();
  }
  else {
    lVar6 = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  if ((y->per_thread_synch).next_priority_read_cycles < lVar6 >> 2) {
    __target_thread = pthread_self();
    uVar4 = pthread_getschedparam
                      (__target_thread,(int *)((long)&local_38 + 4),(sched_param *)&local_38);
    if (uVar4 == 0) {
      (y->per_thread_synch).priority = local_38._0_4_;
      dVar12 = base_internal::UnscaledCycleClock::Frequency();
      (y->per_thread_synch).next_priority_read_cycles = (lVar6 >> 2) + (long)(dVar12 * 0.25);
    }
    else {
      raw_log_internal::RawLog
                (kError,"mutex.cc",0x3bb,"pthread_getschedparam failed: %d",(ulong)uVar4);
    }
  }
  goto LAB_00340f45;
}

Assistant:

static PerThreadSynch* Enqueue(PerThreadSynch* head, SynchWaitParams* waitp,
                               intptr_t mu, int flags) {
  // If we have been given a cv_word, call CondVarEnqueue() and return
  // the previous head of the Mutex waiter queue.
  if (waitp->cv_word != nullptr) {
    CondVarEnqueue(waitp);
    return head;
  }

  PerThreadSynch* s = waitp->thread;
  ABSL_RAW_CHECK(
      s->waitp == nullptr ||    // normal case
          s->waitp == waitp ||  // Fer()---transfer from condition variable
          s->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  s->waitp = waitp;
  s->skip = nullptr;   // maintain skip invariant (see above)
  s->may_skip = true;  // always true on entering queue
  s->wake = false;     // not being woken
  s->cond_waiter = ((flags & kMuIsCond) != 0);
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
  if ((flags & kMuIsFer) == 0) {
    assert(s == Synch_GetPerThread());
    int64_t now_cycles = CycleClock::Now();
    if (s->next_priority_read_cycles < now_cycles) {
      // Every so often, update our idea of the thread's priority.
      // pthread_getschedparam() is 5% of the block/wakeup time;
      // CycleClock::Now() is 0.5%.
      int policy;
      struct sched_param param;
      const int err = pthread_getschedparam(pthread_self(), &policy, &param);
      if (err != 0) {
        ABSL_RAW_LOG(ERROR, "pthread_getschedparam failed: %d", err);
      } else {
        s->priority = param.sched_priority;
        s->next_priority_read_cycles =
            now_cycles + static_cast<int64_t>(CycleClock::Frequency());
      }
    }
  }
#endif
  if (head == nullptr) {         // s is the only waiter
    s->next = s;                 // it's the only entry in the cycle
    s->readers = mu;             // reader count is from mu word
    s->maybe_unlocking = false;  // no one is searching an empty list
    head = s;                    // s is new head
  } else {
    PerThreadSynch* enqueue_after = nullptr;  // we'll put s after this element
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
    if (s->priority > head->priority) {  // s's priority is above head's
      // try to put s in priority-fifo order, or failing that at the front.
      if (!head->maybe_unlocking) {
        // No unlocker can be scanning the queue, so we can insert into the
        // middle of the queue.
        //
        // Within a skip chain, all waiters have the same priority, so we can
        // skip forward through the chains until we find one with a lower
        // priority than the waiter to be enqueued.
        PerThreadSynch* advance_to = head;  // next value of enqueue_after
        do {
          enqueue_after = advance_to;
          // (side-effect: optimizes skip chain)
          advance_to = Skip(enqueue_after->next);
        } while (s->priority <= advance_to->priority);
        // termination guaranteed because s->priority > head->priority
        // and head is the end of a skip chain
      } else if (waitp->how == kExclusive && waitp->cond == nullptr) {
        // An unlocker could be scanning the queue, but we know it will recheck
        // the queue front for writers that have no condition, which is what s
        // is, so an insert at front is safe.
        enqueue_after = head;  // add after head, at front
      }
    }
#endif
    if (enqueue_after != nullptr) {
      s->next = enqueue_after->next;
      enqueue_after->next = s;

      // enqueue_after can be: head, Skip(...), or cur.
      // The first two imply enqueue_after->skip == nullptr, and
      // the last is used only if MuEquivalentWaiter(s, cur).
      // We require this because clearing enqueue_after->skip
      // is impossible; enqueue_after's predecessors might also
      // incorrectly skip over s if we were to allow other
      // insertion points.
      ABSL_RAW_CHECK(enqueue_after->skip == nullptr ||
                         MuEquivalentWaiter(enqueue_after, s),
                     "Mutex Enqueue failure");

      if (enqueue_after != head && enqueue_after->may_skip &&
          MuEquivalentWaiter(enqueue_after, enqueue_after->next)) {
        // enqueue_after can skip to its new successor, s
        enqueue_after->skip = enqueue_after->next;
      }
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                   // s may skip to its successor
      }
    } else if ((flags & kMuHasBlocked) &&
               (s->priority >= head->next->priority) &&
               (!head->maybe_unlocking ||
                (waitp->how == kExclusive &&
                 Condition::GuaranteedEqual(waitp->cond, nullptr)))) {
      // This thread has already waited, then was woken, then failed to acquire
      // the mutex and now tries to requeue. Try to requeue it at head,
      // otherwise it can suffer bad latency (wait whole queue several times).
      // However, we need to be conservative. First, we need to ensure that we
      // respect priorities. Then, we need to be careful to not break wait
      // queue invariants: we require either that unlocker is not scanning
      // the queue or that the current thread is a writer with no condition
      // (unlocker will recheck the queue for such waiters).
      s->next = head->next;
      head->next = s;
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                   // s may skip to its successor
      }
    } else {  // enqueue not done any other way, so
              // we're inserting s at the back
      // s will become new head; copy data from head into it
      s->next = head->next;  // add s after head
      head->next = s;
      s->readers = head->readers;  // reader count is from previous head
      s->maybe_unlocking = head->maybe_unlocking;  // same for unlock hint
      if (head->may_skip && MuEquivalentWaiter(head, s)) {
        // head now has successor; may skip
        head->skip = s;
      }
      head = s;  // s is new head
    }
  }
  s->state.store(PerThreadSynch::kQueued, std::memory_order_relaxed);
  return head;
}